

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shaping_clipper.cpp
# Opt level: O2

void __thiscall shaping_clipper::generate_hann_window(shaping_clipper *this)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  float fVar4;
  double dVar5;
  
  uVar1 = this->max_oversample * this->size;
  uVar3 = 0;
  uVar2 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar2 = uVar3;
  }
  for (; uVar2 != uVar3; uVar3 = uVar3 + 1) {
    dVar5 = cos(((double)(int)uVar3 * 6.283185307179586) / (double)(int)uVar1);
    fVar4 = (float)((1.0 - dVar5) * 0.5);
    dVar5 = (double)fVar4;
    (this->window).super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data
    ._M_start[uVar3] = fVar4;
    (this->inv_window).super__Vector_base<float,_std::allocator<float>_>._M_impl.
    super__Vector_impl_data._M_start[uVar3] =
         (float)(double)(-(ulong)(0.1 < dVar5) & (ulong)(1.0 / dVar5));
  }
  return;
}

Assistant:

void shaping_clipper::generate_hann_window() {
    double pi = acos(-1);
    int window_size = this->size * this->max_oversample;
    for (int i = 0; i < window_size; i++) {
        float value = 0.5 * (1 - cos(2 * pi * i / window_size));
        this->window[i] = value;
        // 1/window to calculate unwindowed peak.
        this->inv_window[i] = value > 0.1 ? 1.0 / value : 0;
    }
}